

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_rowcol_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m128i *palVar1;
  __m128i *palVar2;
  int *piVar3;
  uint *puVar4;
  undefined4 *puVar5;
  __m128i *palVar6;
  undefined1 (*pauVar7) [12];
  undefined4 *puVar8;
  void *pvVar9;
  parasail_matrix_t *ppVar10;
  void *pvVar11;
  void *pvVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [12];
  int iVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  parasail_result_t *ppVar34;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  long lVar35;
  __m128i *palVar36;
  uint uVar37;
  ulong uVar38;
  long lVar39;
  uint uVar40;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  ulong uVar41;
  int iVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  int iVar47;
  ulong uVar48;
  uint uVar49;
  ulong uVar50;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  ulong uVar55;
  ulong uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  ulong uVar59;
  int iVar60;
  ulong uVar61;
  int iVar63;
  int iVar64;
  int iVar67;
  undefined1 auVar62 [16];
  ulong uVar65;
  ulong uVar66;
  uint uVar68;
  ulong uVar69;
  uint uVar74;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  uint uVar73;
  uint uVar76;
  undefined1 auVar72 [16];
  ulong uVar75;
  uint uVar79;
  uint uVar80;
  undefined1 auVar77 [16];
  uint uVar81;
  uint uVar82;
  undefined1 auVar78 [16];
  uint uVar83;
  uint uVar85;
  uint uVar86;
  uint uVar87;
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  uint uVar89;
  uint uVar91;
  int iVar92;
  uint uVar93;
  undefined1 auVar90 [16];
  int iVar94;
  uint uVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar109 [16];
  uint uVar110;
  int iVar111;
  uint uVar112;
  int iVar113;
  uint uVar114;
  int iVar115;
  uint uVar116;
  int iVar117;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i_32_t h;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar9 = (profile->profile32).score;
    if (pvVar9 == (void *)0x0) {
      parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar10 = profile->matrix;
      if (ppVar10 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar40 = profile->s1Len;
        if ((int)uVar40 < 1) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_rowcol_scan_profile_sse41_128_32_cold_1();
        }
        else {
          iVar42 = uVar40 - 1;
          uVar48 = (ulong)uVar40 + 3 >> 2;
          iVar47 = (int)uVar48;
          iVar29 = iVar42 / iVar47;
          uVar49 = iVar42 % iVar47;
          iVar46 = -open;
          iVar60 = ppVar10->min;
          uVar37 = 0x80000000 - iVar60;
          if (iVar60 != iVar46 && SBORROW4(iVar60,iVar46) == iVar60 + open < 0) {
            uVar37 = open | 0x80000000;
          }
          local_1a8._0_4_ = uVar37;
          pvVar11 = (profile->profile32).matches;
          uVar30 = 0x7ffffffe - ppVar10->max;
          local_1b8._0_4_ = uVar30;
          pvVar12 = (profile->profile32).similar;
          ppVar34 = parasail_result_new_rowcol3((uint)((ulong)uVar40 + 3) & 0x7ffffffc,s2Len);
          if (ppVar34 != (parasail_result_t *)0x0) {
            ppVar34->flag = ppVar34->flag | 0x4450401;
            b = parasail_memalign___m128i(0x10,uVar48);
            b_00 = parasail_memalign___m128i(0x10,uVar48);
            b_01 = parasail_memalign___m128i(0x10,uVar48);
            b_02 = parasail_memalign___m128i(0x10,uVar48);
            ptr = parasail_memalign___m128i(0x10,uVar48);
            b_03 = parasail_memalign___m128i(0x10,uVar48);
            b_04 = parasail_memalign___m128i(0x10,uVar48);
            b_05 = parasail_memalign___m128i(0x10,uVar48);
            ptr_00 = parasail_memalign___m128i(0x10,uVar48);
            ptr_01 = parasail_memalign___m128i(0x10,uVar48);
            ptr_02 = parasail_memalign___m128i(0x10,uVar48);
            ptr_03 = parasail_memalign___m128i(0x10,uVar48);
            ptr_04 = parasail_memalign___m128i(0x10,uVar48);
            ptr_05 = parasail_memalign___m128i(0x10,uVar48);
            ptr_06 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            c[1]._0_1_ = (ptr_02 == (__m128i *)0x0 ||
                         (ptr_01 == (__m128i *)0x0 ||
                         (ptr_00 == (__m128i *)0x0 || b_05 == (__m128i *)0x0))) ||
                         ((b_04 == (__m128i *)0x0 ||
                          (b_03 == (__m128i *)0x0 || ptr == (__m128i *)0x0)) ||
                         ((b_02 == (__m128i *)0x0 || b_01 == (__m128i *)0x0) ||
                         (b_00 == (__m128i *)0x0 || b == (__m128i *)0x0)));
            if ((ptr_06 != (int32_t *)0x0 &&
                (ptr_05 != (__m128i *)0x0 && (ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0))
                ) && ((ptr_02 != (__m128i *)0x0 &&
                      (ptr_01 != (__m128i *)0x0 &&
                      (ptr_00 != (__m128i *)0x0 && b_05 != (__m128i *)0x0))) &&
                     ((b_04 != (__m128i *)0x0 && (b_03 != (__m128i *)0x0 && ptr != (__m128i *)0x0))
                     && ((b_02 != (__m128i *)0x0 && b_01 != (__m128i *)0x0) &&
                        (b_00 != (__m128i *)0x0 && b != (__m128i *)0x0))))) {
              iVar31 = s2Len + -1;
              iVar32 = 3 - iVar29;
              uVar37 = uVar37 + 1;
              iVar33 = -(iVar47 * gap);
              c[0] = uVar48;
              uVar41 = uVar48;
              parasail_memset___m128i(b_03,c,uVar48);
              c_00[1] = extraout_RDX_00;
              c_00[0] = uVar48;
              parasail_memset___m128i(b_04,c_00,uVar41);
              c_01[1] = extraout_RDX_01;
              c_01[0] = uVar48;
              parasail_memset___m128i(b_05,c_01,uVar41);
              c_02[1] = extraout_RDX_02;
              c_02[0] = uVar48;
              parasail_memset___m128i(b,c_02,uVar41);
              c_03[1] = extraout_RDX_03;
              c_03[0] = uVar48;
              parasail_memset___m128i(b_00,c_03,uVar41);
              c_04[1] = extraout_RDX_04;
              c_04[0] = uVar48;
              parasail_memset___m128i(b_01,c_04,uVar41);
              c_05[1] = extraout_RDX_05;
              c_05[0] = uVar48;
              parasail_memset___m128i(b_02,c_05,uVar41);
              iVar60 = -open;
              iVar63 = -open;
              iVar64 = -open;
              iVar67 = -open;
              uVar38 = (ulong)(iVar47 - 1);
              lVar35 = uVar38 << 4;
              auVar51 = pmovsxbd(extraout_XMM0,0x1010101);
              uVar41 = uVar48;
              do {
                piVar3 = (int *)((long)*ptr_04 + lVar35);
                *piVar3 = iVar60;
                piVar3[1] = iVar63;
                piVar3[2] = iVar64;
                piVar3[3] = iVar67;
                *(undefined1 (*) [16])((long)*ptr_05 + lVar35) = auVar51;
                iVar60 = iVar60 - gap;
                iVar63 = iVar63 - gap;
                iVar64 = iVar64 - gap;
                iVar67 = iVar67 - gap;
                auVar77._0_4_ = auVar51._0_4_ + 1;
                auVar77._4_4_ = auVar51._4_4_ + 1;
                auVar77._8_4_ = auVar51._8_4_ + 1;
                auVar77._12_4_ = auVar51._12_4_ + 1;
                lVar35 = lVar35 + -0x10;
                iVar92 = (int)uVar41;
                uVar40 = iVar92 - 1;
                uVar41 = (ulong)uVar40;
                auVar51 = auVar77;
              } while (uVar40 != 0 && 0 < iVar92);
              uVar41 = 0;
              iVar60 = iVar46;
              do {
                lVar35 = 0;
                iVar63 = iVar60;
                do {
                  *(int *)((long)&local_48 + lVar35 * 4) = iVar63;
                  lVar35 = lVar35 + 1;
                  iVar63 = iVar63 - iVar47 * gap;
                } while (lVar35 != 4);
                ptr[uVar41][0] = local_48;
                ptr[uVar41][1] = lStack_40;
                uVar41 = uVar41 + 1;
                iVar60 = iVar60 - gap;
              } while (uVar41 != uVar48);
              *ptr_06 = 0;
              uVar41 = 1;
              do {
                ptr_06[uVar41] = iVar46;
                uVar41 = uVar41 + 1;
                iVar46 = iVar46 - gap;
              } while (s2Len + 1 != uVar41);
              palVar6 = ptr + uVar38;
              palVar1 = b_03 + uVar38;
              palVar2 = b_04 + uVar38;
              palVar36 = b_05 + uVar38;
              iVar60 = 1;
              if (1 < iVar32) {
                iVar60 = iVar32;
              }
              uVar41 = 1;
              if (1 < s2Len) {
                uVar41 = (ulong)(uint)s2Len;
              }
              lVar35 = (ulong)(iVar47 + (uint)(iVar47 == 0)) << 4;
              uVar38 = 0;
              uVar40 = uVar37;
              uVar79 = uVar37;
              uVar80 = uVar37;
              uVar81 = uVar37;
              uVar89 = uVar30;
              uVar91 = uVar30;
              uVar93 = uVar30;
              uVar95 = uVar30;
              do {
                iStack_154 = (int)(*palVar2)[0];
                iStack_150 = *(int *)((long)*palVar2 + 4);
                iStack_14c = (int)(*palVar2)[1];
                iStack_144 = (int)(*palVar36)[0];
                iStack_140 = *(int *)((long)*palVar36 + 4);
                iStack_13c = (int)(*palVar36)[1];
                local_158 = 0;
                local_148 = 0;
                lVar45 = uVar48 * (long)ppVar10->mapper[(byte)s2[uVar38]] * 0x10;
                uVar110 = uVar37 - (int)(*ptr_04)[0];
                uVar112 = uVar37 - *(int *)((long)*ptr_04 + 4);
                uVar114 = uVar37 - (int)(*ptr_04)[1];
                uVar116 = uVar37 - *(int *)((long)*ptr_04 + 0xc);
                auVar90 = (undefined1  [16])0x0;
                lVar39 = 0;
                local_1e8 = ZEXT816(0);
                local_1f8 = ZEXT816(0);
                auVar51 = local_1b8;
                auVar77 = local_1a8;
                uVar83 = uVar37;
                uVar85 = uVar37;
                uVar86 = uVar37;
                uVar87 = uVar37;
                local_1b8._0_4_ = 0;
                local_1b8._4_4_ = (int)(*palVar1)[0];
                local_1b8._8_4_ = *(int *)((long)*palVar1 + 4);
                local_1b8._12_4_ = (int)(*palVar1)[1];
                local_1a8._0_4_ = ptr_06[uVar38];
                local_1a8._4_4_ = (int)(*palVar6)[0];
                local_1a8._8_4_ = *(int *)((long)*palVar6 + 4);
                iVar46 = (int)(*palVar6)[1];
                do {
                  pauVar7 = (undefined1 (*) [12])((long)*ptr + lVar39);
                  auVar28 = *pauVar7;
                  iVar63 = *(int *)pauVar7[1];
                  auVar54 = *(undefined1 (*) [16])((long)*b_03 + lVar39);
                  piVar3 = (int *)((long)*b + lVar39);
                  iVar64 = *(int *)*pauVar7 - open;
                  iVar67 = *(int *)(*pauVar7 + 4) - open;
                  iVar92 = *(int *)(*pauVar7 + 8) - open;
                  iVar94 = iVar63 - open;
                  iVar96 = *piVar3 - gap;
                  iVar97 = piVar3[1] - gap;
                  iVar98 = piVar3[2] - gap;
                  iVar99 = piVar3[3] - gap;
                  auVar100._0_4_ = -(uint)(iVar96 < iVar64);
                  auVar100._4_4_ = -(uint)(iVar97 < iVar67);
                  auVar100._8_4_ = -(uint)(iVar98 < iVar92);
                  auVar100._12_4_ = -(uint)(iVar99 < iVar94);
                  auVar105 = blendvps(*(undefined1 (*) [16])((long)*b_00 + lVar39),auVar54,auVar100)
                  ;
                  auVar71 = *(undefined1 (*) [16])((long)*b_04 + lVar39);
                  auVar88 = blendvps(*(undefined1 (*) [16])((long)*b_01 + lVar39),auVar71,auVar100);
                  auVar106 = *(undefined1 (*) [16])((long)*b_05 + lVar39);
                  auVar100 = blendvps(*(undefined1 (*) [16])((long)*b_02 + lVar39),auVar106,auVar100
                                     );
                  piVar3 = (int *)((long)*ptr_04 + lVar39);
                  iVar111 = uVar110 + *piVar3;
                  iVar113 = uVar112 + piVar3[1];
                  iVar115 = uVar114 + piVar3[2];
                  iVar117 = uVar116 + piVar3[3];
                  auVar52._0_4_ = -(uint)((int)uVar83 < iVar111);
                  auVar52._4_4_ = -(uint)((int)uVar85 < iVar113);
                  auVar52._8_4_ = -(uint)((int)uVar86 < iVar115);
                  auVar52._12_4_ = -(uint)((int)uVar87 < iVar117);
                  local_1f8 = blendvps(local_1f8,in_XMM12,auVar52);
                  local_1e8 = blendvps(local_1e8,auVar51,auVar52);
                  uVar110 = (uint)(iVar96 < iVar64) * iVar64 | (uint)(iVar96 >= iVar64) * iVar96;
                  uVar112 = (uint)(iVar97 < iVar67) * iVar67 | (uint)(iVar97 >= iVar67) * iVar97;
                  uVar114 = (uint)(iVar98 < iVar92) * iVar92 | (uint)(iVar98 >= iVar92) * iVar98;
                  uVar116 = (uint)(iVar99 < iVar94) * iVar94 | (uint)(iVar99 >= iVar94) * iVar99;
                  uVar83 = (iVar111 < (int)uVar83) * uVar83 |
                           (uint)(iVar111 >= (int)uVar83) * iVar111;
                  uVar85 = (iVar113 < (int)uVar85) * uVar85 |
                           (uint)(iVar113 >= (int)uVar85) * iVar113;
                  uVar86 = (iVar115 < (int)uVar86) * uVar86 |
                           (uint)(iVar115 >= (int)uVar86) * iVar115;
                  uVar87 = (iVar117 < (int)uVar87) * uVar87 |
                           (uint)(iVar117 >= (int)uVar87) * iVar117;
                  piVar3 = (int *)((long)*ptr_05 + lVar39);
                  auVar51._0_4_ = auVar77._0_4_ + *piVar3;
                  auVar51._4_4_ = auVar77._4_4_ + piVar3[1];
                  auVar51._8_4_ = auVar77._8_4_ + piVar3[2];
                  auVar51._12_4_ = auVar77._12_4_ + piVar3[3];
                  auVar90 = blendvps(auVar90,auVar51,auVar52);
                  piVar3 = (int *)((long)pvVar9 + lVar39 + lVar45);
                  iVar64 = local_1a8._0_4_ + *piVar3;
                  local_1a8._4_4_ = local_1a8._4_4_ + piVar3[1];
                  local_1a8._8_4_ = local_1a8._8_4_ + piVar3[2];
                  iVar46 = iVar46 + piVar3[3];
                  piVar3 = (int *)((long)pvVar11 + lVar39 + lVar45);
                  auVar102._0_4_ = local_1b8._0_4_ + *piVar3;
                  auVar102._4_4_ = local_1b8._4_4_ + piVar3[1];
                  auVar102._8_4_ = local_1b8._8_4_ + piVar3[2];
                  auVar102._12_4_ = local_1b8._12_4_ + piVar3[3];
                  piVar3 = (int *)((long)pvVar12 + lVar39 + lVar45);
                  auVar70._0_4_ = local_158 + *piVar3;
                  auVar70._4_4_ = iStack_154 + piVar3[1];
                  auVar70._8_4_ = iStack_150 + piVar3[2];
                  auVar70._12_4_ = iStack_14c + piVar3[3];
                  auVar53._0_4_ = -(uint)(iVar64 < (int)uVar110);
                  auVar53._4_4_ = -(uint)((int)local_1a8._4_4_ < (int)uVar112);
                  auVar53._8_4_ = -(uint)((int)local_1a8._8_4_ < (int)uVar114);
                  auVar53._12_4_ = -(uint)(iVar46 < (int)uVar116);
                  in_XMM12 = blendvps(auVar102,auVar105,auVar53);
                  auVar51 = blendvps(auVar70,auVar88,auVar53);
                  auVar101._0_4_ = auVar100._0_4_ + 1;
                  auVar101._4_4_ = auVar100._4_4_ + 1;
                  auVar101._8_4_ = auVar100._8_4_ + 1;
                  auVar101._12_4_ = auVar100._12_4_ + 1;
                  auVar57._0_4_ = local_148 + 1;
                  auVar57._4_4_ = iStack_144 + 1;
                  auVar57._8_4_ = iStack_140 + 1;
                  auVar57._12_4_ = iStack_13c + 1;
                  auVar77 = blendvps(auVar57,auVar101,auVar53);
                  puVar4 = (uint *)((long)*b + lVar39);
                  *puVar4 = uVar110;
                  puVar4[1] = uVar112;
                  puVar4[2] = uVar114;
                  puVar4[3] = uVar116;
                  *(undefined1 (*) [16])((long)*b_00 + lVar39) = auVar105;
                  *(undefined1 (*) [16])((long)*b_01 + lVar39) = auVar88;
                  *(undefined1 (*) [16])((long)*b_02 + lVar39) = auVar101;
                  uVar110 = (uint)((int)uVar110 < iVar64) * iVar64 |
                            ((int)uVar110 >= iVar64) * uVar110;
                  uVar112 = (uint)((int)uVar112 < (int)local_1a8._4_4_) * local_1a8._4_4_ |
                            ((int)uVar112 >= (int)local_1a8._4_4_) * uVar112;
                  uVar114 = (uint)((int)uVar114 < (int)local_1a8._8_4_) * local_1a8._8_4_ |
                            ((int)uVar114 >= (int)local_1a8._8_4_) * uVar114;
                  uVar116 = (uint)((int)uVar116 < iVar46) * iVar46 |
                            ((int)uVar116 >= iVar46) * uVar116;
                  piVar3 = (int *)((long)*ptr + lVar39);
                  *piVar3 = iVar64;
                  piVar3[1] = local_1a8._4_4_;
                  piVar3[2] = local_1a8._8_4_;
                  piVar3[3] = iVar46;
                  *(undefined1 (*) [16])((long)*b_03 + lVar39) = auVar102;
                  *(undefined1 (*) [16])((long)*b_04 + lVar39) = auVar70;
                  *(undefined1 (*) [16])((long)*b_05 + lVar39) = auVar57;
                  lVar39 = lVar39 + 0x10;
                  local_148 = auVar106._0_4_;
                  iStack_144 = auVar106._4_4_;
                  iStack_140 = auVar106._8_4_;
                  iStack_13c = auVar106._12_4_;
                  local_158 = auVar71._0_4_;
                  iStack_154 = auVar71._4_4_;
                  iStack_150 = auVar71._8_4_;
                  iStack_14c = auVar71._12_4_;
                  local_1b8._0_4_ = auVar54._0_4_;
                  local_1b8._4_4_ = auVar54._4_4_;
                  local_1b8._8_4_ = auVar54._8_4_;
                  local_1b8._12_4_ = auVar54._12_4_;
                  local_1a8._0_4_ = auVar28._0_4_;
                  local_1a8._4_4_ = auVar28._4_4_;
                  local_1a8._8_4_ = auVar28._8_4_;
                  iVar46 = iVar63;
                } while (lVar35 != lVar39);
                lVar39 = in_XMM12._8_8_;
                uVar66 = in_XMM12._0_8_;
                in_XMM12._0_8_ = uVar66 << 0x20;
                in_XMM12._8_8_ = lVar39 << 0x20 | uVar66 >> 0x20;
                local_1b8._0_8_ = auVar51._0_8_ << 0x20;
                local_1b8._8_8_ = auVar51._8_8_ << 0x20 | auVar51._0_8_ >> 0x20;
                local_1a8._0_8_ = auVar77._0_8_ << 0x20;
                local_1a8._8_8_ = auVar77._8_8_ << 0x20 | auVar77._0_8_ >> 0x20;
                uVar66 = uVar38 + 1;
                iVar46 = ptr_06[uVar38 + 1];
                iVar63 = (int)(*ptr_04)[0] + iVar46;
                iVar64 = *(int *)((long)*ptr_04 + 4) + uVar110;
                iVar67 = (int)(*ptr_04)[1] + uVar112;
                iVar92 = *(int *)((long)*ptr_04 + 0xc) + uVar114;
                auVar54._0_4_ = -(uint)(iVar63 < (int)uVar83);
                auVar54._4_4_ = -(uint)(iVar64 < (int)uVar85);
                auVar54._8_4_ = -(uint)(iVar67 < (int)uVar86);
                auVar54._12_4_ = -(uint)(iVar92 < (int)uVar87);
                auVar71._0_4_ =
                     (iVar63 < (int)uVar83) * uVar83 | (uint)(iVar63 >= (int)uVar83) * iVar63;
                auVar71._4_4_ =
                     (iVar64 < (int)uVar85) * uVar85 | (uint)(iVar64 >= (int)uVar85) * iVar64;
                auVar71._8_4_ =
                     (iVar67 < (int)uVar86) * uVar86 | (uint)(iVar67 >= (int)uVar86) * iVar67;
                auVar71._12_4_ =
                     (iVar92 < (int)uVar87) * uVar87 | (uint)(iVar92 >= (int)uVar87) * iVar92;
                auVar51 = blendvps(in_XMM12,local_1f8,auVar54);
                auVar106 = blendvps(local_1b8,local_1e8,auVar54);
                auVar88._4_4_ = *(int *)((long)*ptr_05 + 4) + auVar77._0_4_;
                auVar88._0_4_ = (int)(*ptr_05)[0];
                auVar88._8_4_ = (int)(*ptr_05)[1] + auVar77._4_4_;
                auVar88._12_4_ = *(int *)((long)*ptr_05 + 0xc) + auVar77._8_4_;
                auVar77 = blendvps(auVar88,auVar90,auVar54);
                iVar63 = 1;
                do {
                  auVar103._0_8_ = auVar51._0_8_ << 0x20;
                  auVar103._8_8_ = auVar51._8_8_ << 0x20 | auVar51._0_8_ >> 0x20;
                  iVar92 = auVar71._0_4_;
                  iVar67 = iVar92 + iVar33;
                  iVar94 = auVar71._4_4_;
                  iVar97 = auVar71._8_4_;
                  iVar96 = iVar94 + iVar33;
                  iVar98 = iVar97 + iVar33;
                  auVar105._0_4_ = -(uint)((int)uVar37 < iVar92);
                  auVar105._4_4_ = -(uint)(iVar67 < iVar94);
                  iVar64 = auVar71._12_4_;
                  auVar105._8_4_ = -(uint)(iVar96 < iVar97);
                  auVar105._12_4_ = -(uint)(iVar98 < iVar64);
                  auVar51 = blendvps(auVar103,auVar51,auVar105);
                  auVar107._0_8_ = auVar106._0_8_ << 0x20;
                  auVar107._8_8_ = auVar106._8_8_ << 0x20 | auVar106._0_8_ >> 0x20;
                  auVar90._4_4_ = auVar77._4_4_ + iVar47;
                  auVar90._0_4_ = auVar77._0_4_ + iVar47;
                  auVar90._8_4_ = auVar77._8_4_ + iVar47;
                  auVar90._12_4_ = 0;
                  auVar106 = blendvps(auVar107,auVar106,auVar105);
                  auVar71._0_4_ =
                       (uint)((int)uVar37 < iVar92) * iVar92 | ((int)uVar37 >= iVar92) * uVar37;
                  auVar71._4_4_ =
                       (uint)(iVar67 < iVar94) * iVar94 | (uint)(iVar67 >= iVar94) * iVar67;
                  auVar71._8_4_ =
                       (uint)(iVar96 < iVar97) * iVar97 | (uint)(iVar96 >= iVar97) * iVar96;
                  auVar71._12_4_ =
                       (uint)(iVar98 < iVar64) * iVar64 | (uint)(iVar98 >= iVar64) * iVar98;
                  auVar77 = blendvps(auVar90 << 0x20,auVar77,auVar105);
                  iVar63 = iVar63 + -1;
                } while (iVar63 == 0);
                auVar104._0_8_ = auVar51._0_8_ << 0x20;
                auVar104._8_8_ = auVar51._8_8_ << 0x20 | auVar51._0_8_ >> 0x20;
                auVar108._0_8_ = auVar106._0_8_ << 0x20;
                auVar108._8_8_ = auVar106._8_8_ << 0x20 | auVar106._0_8_ >> 0x20;
                auVar109._0_8_ = auVar77._0_8_ << 0x20;
                auVar109._8_8_ = auVar77._8_8_ << 0x20 | auVar77._0_8_ >> 0x20;
                auVar106._0_4_ = -(uint)(iVar46 < (int)uVar37);
                auVar106._4_4_ = -(uint)((int)uVar110 < (int)auVar71._0_4_);
                auVar106._8_4_ = -(uint)((int)uVar112 < (int)auVar71._4_4_);
                auVar106._12_4_ = -(uint)((int)uVar114 < (int)auVar71._8_4_);
                uVar85 = (iVar46 < (int)uVar37) * uVar37 | (uint)(iVar46 >= (int)uVar37) * iVar46;
                uVar86 = ((int)uVar110 < (int)auVar71._0_4_) * auVar71._0_4_ |
                         ((int)uVar110 >= (int)auVar71._0_4_) * uVar110;
                uVar87 = ((int)uVar112 < (int)auVar71._4_4_) * auVar71._4_4_ |
                         ((int)uVar112 >= (int)auVar71._4_4_) * uVar112;
                uVar110 = ((int)uVar114 < (int)auVar71._8_4_) * auVar71._8_4_ |
                          ((int)uVar114 >= (int)auVar71._8_4_) * uVar114;
                auVar90 = blendvps(in_XMM12,auVar104,auVar106);
                auVar51 = blendvps(local_1b8,auVar108,auVar106);
                auVar77 = blendvps(local_1a8,auVar109,auVar106);
                lVar39 = 0;
                uVar83 = uVar37;
                do {
                  iVar46 = uVar85 - open;
                  iVar63 = uVar86 - open;
                  iVar64 = uVar87 - open;
                  iVar67 = uVar110 - open;
                  iVar92 = uVar83 - gap;
                  iVar94 = auVar71._0_4_ - gap;
                  iVar96 = auVar71._4_4_ - gap;
                  iVar97 = auVar71._8_4_ - gap;
                  auVar58._0_4_ = -(uint)(iVar92 < iVar46);
                  auVar58._4_4_ = -(uint)(iVar94 < iVar63);
                  auVar58._8_4_ = -(uint)(iVar96 < iVar64);
                  auVar58._12_4_ = -(uint)(iVar97 < iVar67);
                  auVar104 = blendvps(auVar104,auVar90,auVar58);
                  auVar108 = blendvps(auVar108,auVar51,auVar58);
                  puVar4 = (uint *)((long)*ptr + lVar39);
                  uVar112 = *puVar4;
                  uVar114 = puVar4[1];
                  uVar116 = puVar4[2];
                  uVar82 = puVar4[3];
                  auVar51 = blendvps(auVar109,auVar77,auVar58);
                  uVar83 = (uint)(iVar46 < iVar92) * iVar92 | (uint)(iVar46 >= iVar92) * iVar46;
                  auVar71._0_4_ =
                       (uint)(iVar63 < iVar94) * iVar94 | (uint)(iVar63 >= iVar94) * iVar63;
                  auVar71._4_4_ =
                       (uint)(iVar64 < iVar96) * iVar96 | (uint)(iVar64 >= iVar96) * iVar64;
                  auVar71._8_4_ =
                       (uint)(iVar67 < iVar97) * iVar97 | (uint)(iVar67 >= iVar97) * iVar67;
                  piVar3 = (int *)((long)*b + lVar39);
                  iVar46 = *piVar3;
                  iVar63 = piVar3[1];
                  iVar64 = piVar3[2];
                  iVar67 = piVar3[3];
                  uVar68 = (iVar46 < (int)uVar112) * uVar112 |
                           (uint)(iVar46 >= (int)uVar112) * iVar46;
                  uVar73 = (iVar63 < (int)uVar114) * uVar114 |
                           (uint)(iVar63 >= (int)uVar114) * iVar63;
                  uVar74 = (iVar64 < (int)uVar116) * uVar116 |
                           (uint)(iVar64 >= (int)uVar116) * iVar64;
                  uVar76 = (iVar67 < (int)uVar82) * uVar82 | (uint)(iVar67 >= (int)uVar82) * iVar67;
                  uVar85 = ((int)uVar68 < (int)uVar83) * uVar83 |
                           ((int)uVar68 >= (int)uVar83) * uVar68;
                  uVar86 = ((int)uVar73 < (int)auVar71._0_4_) * auVar71._0_4_ |
                           ((int)uVar73 >= (int)auVar71._0_4_) * uVar73;
                  uVar87 = ((int)uVar74 < (int)auVar71._4_4_) * auVar71._4_4_ |
                           ((int)uVar74 >= (int)auVar71._4_4_) * uVar74;
                  uVar110 = ((int)uVar76 < (int)auVar71._8_4_) * auVar71._8_4_ |
                            ((int)uVar76 >= (int)auVar71._8_4_) * uVar76;
                  auVar62._0_4_ = -(uint)(uVar112 == uVar85);
                  auVar62._4_4_ = -(uint)(uVar114 == uVar86);
                  auVar62._8_4_ = -(uint)(uVar116 == uVar87);
                  auVar62._12_4_ = -(uint)(uVar82 == uVar110);
                  auVar72._0_4_ = -(uint)((int)uVar83 < (int)uVar68);
                  auVar72._4_4_ = -(uint)((int)auVar71._0_4_ < (int)uVar73);
                  auVar72._8_4_ = -(uint)((int)auVar71._4_4_ < (int)uVar74);
                  auVar72._12_4_ = -(uint)((int)auVar71._8_4_ < (int)uVar76);
                  auVar77 = blendvps(auVar104,*(undefined1 (*) [16])((long)*b_00 + lVar39),auVar72);
                  auVar90 = blendvps(auVar77,*(undefined1 (*) [16])((long)*b_03 + lVar39),auVar62);
                  auVar109._0_4_ = auVar51._0_4_ + 1;
                  auVar109._4_4_ = auVar51._4_4_ + 1;
                  auVar109._8_4_ = auVar51._8_4_ + 1;
                  auVar109._12_4_ = auVar51._12_4_ + 1;
                  auVar51 = blendvps(auVar108,*(undefined1 (*) [16])((long)*b_01 + lVar39),auVar72);
                  auVar51 = blendvps(auVar51,*(undefined1 (*) [16])((long)*b_04 + lVar39),auVar62);
                  auVar77 = blendvps(auVar109,*(undefined1 (*) [16])((long)*b_02 + lVar39),auVar72);
                  auVar77 = blendvps(auVar77,*(undefined1 (*) [16])((long)*b_05 + lVar39),auVar62);
                  puVar4 = (uint *)((long)*ptr + lVar39);
                  *puVar4 = uVar85;
                  puVar4[1] = uVar86;
                  puVar4[2] = uVar87;
                  puVar4[3] = uVar110;
                  *(undefined1 (*) [16])((long)*b_03 + lVar39) = auVar90;
                  *(undefined1 (*) [16])((long)*b_04 + lVar39) = auVar51;
                  *(undefined1 (*) [16])((long)*b_05 + lVar39) = auVar77;
                  uVar89 = ((int)uVar85 < (int)uVar89) * uVar85 |
                           ((int)uVar85 >= (int)uVar89) * uVar89;
                  uVar91 = ((int)uVar86 < (int)uVar91) * uVar86 |
                           ((int)uVar86 >= (int)uVar91) * uVar91;
                  uVar93 = ((int)uVar87 < (int)uVar93) * uVar87 |
                           ((int)uVar87 >= (int)uVar93) * uVar93;
                  uVar95 = ((int)uVar110 < (int)uVar95) * uVar110 |
                           ((int)uVar110 >= (int)uVar95) * uVar95;
                  uVar40 = ((int)uVar40 < (int)uVar85) * uVar85 |
                           ((int)uVar40 >= (int)uVar85) * uVar40;
                  uVar79 = ((int)uVar79 < (int)uVar86) * uVar86 |
                           ((int)uVar79 >= (int)uVar86) * uVar79;
                  uVar80 = ((int)uVar80 < (int)uVar87) * uVar87 |
                           ((int)uVar80 >= (int)uVar87) * uVar80;
                  uVar81 = ((int)uVar81 < (int)uVar110) * uVar110 |
                           ((int)uVar81 >= (int)uVar110) * uVar81;
                  iVar46 = auVar90._0_4_;
                  uVar40 = (uint)((int)uVar40 < iVar46) * iVar46 | ((int)uVar40 >= iVar46) * uVar40;
                  iVar46 = auVar90._4_4_;
                  uVar79 = (uint)((int)uVar79 < iVar46) * iVar46 | ((int)uVar79 >= iVar46) * uVar79;
                  iVar46 = auVar90._8_4_;
                  uVar80 = (uint)((int)uVar80 < iVar46) * iVar46 | ((int)uVar80 >= iVar46) * uVar80;
                  iVar46 = auVar90._12_4_;
                  uVar81 = (uint)((int)uVar81 < iVar46) * iVar46 | ((int)uVar81 >= iVar46) * uVar81;
                  iVar46 = auVar77._0_4_;
                  iVar63 = auVar51._0_4_;
                  uVar112 = (uint)(iVar63 < iVar46) * iVar46 | (uint)(iVar63 >= iVar46) * iVar63;
                  iVar46 = auVar77._4_4_;
                  iVar63 = auVar51._4_4_;
                  uVar114 = (uint)(iVar63 < iVar46) * iVar46 | (uint)(iVar63 >= iVar46) * iVar63;
                  iVar46 = auVar77._8_4_;
                  iVar63 = auVar51._8_4_;
                  iVar64 = auVar51._12_4_;
                  uVar116 = (uint)(iVar63 < iVar46) * iVar46 | (uint)(iVar63 >= iVar46) * iVar63;
                  iVar46 = auVar77._12_4_;
                  uVar82 = (uint)(iVar64 < iVar46) * iVar46 | (uint)(iVar64 >= iVar46) * iVar64;
                  uVar40 = ((int)uVar112 < (int)uVar40) * uVar40 |
                           ((int)uVar112 >= (int)uVar40) * uVar112;
                  uVar79 = ((int)uVar114 < (int)uVar79) * uVar79 |
                           ((int)uVar114 >= (int)uVar79) * uVar114;
                  uVar80 = ((int)uVar116 < (int)uVar80) * uVar80 |
                           ((int)uVar116 >= (int)uVar80) * uVar116;
                  uVar81 = ((int)uVar82 < (int)uVar81) * uVar81 |
                           ((int)uVar82 >= (int)uVar81) * uVar82;
                  lVar39 = lVar39 + 0x10;
                } while (lVar35 != lVar39);
                uVar69 = ptr[uVar49][0];
                uVar75 = ptr[uVar49][1];
                uVar61 = b_03[uVar49][0];
                uVar65 = b_03[uVar49][1];
                uVar56 = b_04[uVar49][0];
                uVar59 = b_04[uVar49][1];
                uVar50 = b_05[uVar49][0];
                uVar55 = b_05[uVar49][1];
                iVar46 = iVar60;
                if (iVar29 < 3) {
                  do {
                    uVar75 = uVar75 << 0x20 | uVar69 >> 0x20;
                    uVar65 = uVar65 << 0x20 | uVar61 >> 0x20;
                    uVar59 = uVar59 << 0x20 | uVar56 >> 0x20;
                    uVar55 = uVar55 << 0x20 | uVar50 >> 0x20;
                    iVar46 = iVar46 + -1;
                    uVar69 = uVar69 << 0x20;
                    uVar61 = uVar61 << 0x20;
                    uVar56 = uVar56 << 0x20;
                    uVar50 = uVar50 << 0x20;
                  } while (iVar46 != 0);
                }
                *(int *)(*((ppVar34->field_4).trace)->trace_del_table + uVar38 * 4) =
                     (int)(uVar75 >> 0x20);
                *(int *)(*(long *)((long)((ppVar34->field_4).trace)->trace_del_table + 8) +
                        uVar38 * 4) = (int)(uVar65 >> 0x20);
                *(int *)(*(long *)((long)((ppVar34->field_4).trace)->trace_del_table + 0x10) +
                        uVar38 * 4) = (int)(uVar59 >> 0x20);
                *(int *)(*(long *)((long)((ppVar34->field_4).trace)->trace_del_table + 0x18) +
                        uVar38 * 4) = (int)(uVar55 >> 0x20);
                uVar38 = uVar66;
              } while (uVar66 != uVar41);
              lVar35 = uVar48 * 4;
              lVar39 = uVar48 * 8;
              lVar45 = uVar48 * 0xc;
              lVar43 = 0;
              do {
                puVar8 = (undefined4 *)((long)*ptr + lVar43 * 4);
                uVar13 = puVar8[1];
                uVar14 = puVar8[2];
                uVar15 = puVar8[3];
                puVar5 = (undefined4 *)((long)*b_03 + lVar43 * 4);
                uVar16 = *puVar5;
                uVar17 = puVar5[1];
                uVar18 = puVar5[2];
                uVar19 = puVar5[3];
                puVar5 = (undefined4 *)((long)*b_04 + lVar43 * 4);
                uVar20 = *puVar5;
                uVar21 = puVar5[1];
                uVar22 = puVar5[2];
                uVar23 = puVar5[3];
                puVar5 = (undefined4 *)((long)*b_05 + lVar43 * 4);
                uVar24 = *puVar5;
                uVar25 = puVar5[1];
                uVar26 = puVar5[2];
                uVar27 = puVar5[3];
                lVar44 = *(long *)((long)((ppVar34->field_4).trace)->trace_del_table + 0x20);
                *(undefined4 *)(lVar44 + lVar43) = *puVar8;
                lVar44 = lVar44 + lVar43;
                *(undefined4 *)(lVar35 + lVar44) = uVar13;
                *(undefined4 *)(lVar39 + lVar44) = uVar14;
                *(undefined4 *)(lVar45 + lVar44) = uVar15;
                lVar44 = *(long *)((long)((ppVar34->field_4).trace)->trace_del_table + 0x28);
                *(undefined4 *)(lVar44 + lVar43) = uVar16;
                lVar44 = lVar44 + lVar43;
                *(undefined4 *)(lVar35 + lVar44) = uVar17;
                *(undefined4 *)(lVar39 + lVar44) = uVar18;
                *(undefined4 *)(lVar45 + lVar44) = uVar19;
                lVar44 = *(long *)((long)((ppVar34->field_4).trace)->trace_del_table + 0x30);
                *(undefined4 *)(lVar44 + lVar43) = uVar20;
                lVar44 = lVar44 + lVar43;
                *(undefined4 *)(lVar35 + lVar44) = uVar21;
                *(undefined4 *)(lVar39 + lVar44) = uVar22;
                *(undefined4 *)(lVar45 + lVar44) = uVar23;
                lVar44 = *(long *)((long)((ppVar34->field_4).trace)->trace_del_table + 0x38);
                *(undefined4 *)(lVar44 + lVar43) = uVar24;
                lVar44 = lVar44 + lVar43;
                *(undefined4 *)(lVar35 + lVar44) = uVar25;
                *(undefined4 *)(lVar39 + lVar44) = uVar26;
                *(undefined4 *)(lVar45 + lVar44) = uVar27;
                lVar43 = lVar43 + 4;
              } while ((ulong)(iVar47 + (uint)(iVar47 == 0)) << 2 != lVar43);
              iVar60 = uVar49 * 0x10;
              uVar48 = ptr[uVar49][0];
              uVar41 = ptr[uVar49][1];
              uVar38 = b_03[uVar49][0];
              uVar66 = b_03[uVar49][1];
              uVar69 = b_04[uVar49][0];
              uVar75 = b_04[uVar49][1];
              uVar61 = b_05[uVar49][0];
              uVar65 = b_05[uVar49][1];
              if (iVar29 < 3) {
                iVar60 = 1;
                if (1 < iVar32) {
                  iVar60 = iVar32;
                }
                do {
                  uVar41 = uVar41 << 0x20 | uVar48 >> 0x20;
                  uVar66 = uVar66 << 0x20 | uVar38 >> 0x20;
                  uVar75 = uVar75 << 0x20 | uVar69 >> 0x20;
                  uVar65 = uVar65 << 0x20 | uVar61 >> 0x20;
                  iVar60 = iVar60 + -1;
                  uVar48 = uVar48 << 0x20;
                  uVar38 = uVar38 << 0x20;
                  uVar69 = uVar69 << 0x20;
                  uVar61 = uVar61 << 0x20;
                } while (iVar60 != 0);
              }
              auVar84._0_4_ = -(uint)((int)uVar89 < (int)uVar37);
              auVar84._4_4_ = -(uint)((int)uVar91 < (int)uVar37);
              auVar84._8_4_ = -(uint)((int)uVar93 < (int)uVar37);
              auVar84._12_4_ = -(uint)((int)uVar95 < (int)uVar37);
              auVar78._0_4_ = -(uint)((int)uVar30 < (int)uVar40);
              auVar78._4_4_ = -(uint)((int)uVar30 < (int)uVar79);
              auVar78._8_4_ = -(uint)((int)uVar30 < (int)uVar80);
              auVar78._12_4_ = -(uint)((int)uVar30 < (int)uVar81);
              iVar60 = movmskps(iVar60,auVar78 | auVar84);
              if (iVar60 == 0) {
                iVar60 = (int)(uVar41 >> 0x20);
                iVar29 = (int)(uVar66 >> 0x20);
                iVar46 = (int)(uVar75 >> 0x20);
                iVar47 = (int)(uVar65 >> 0x20);
              }
              else {
                *(byte *)&ppVar34->flag = (byte)ppVar34->flag | 0x40;
                iVar60 = 0;
                iVar29 = 0;
                iVar46 = 0;
                iVar47 = 0;
                iVar31 = 0;
                iVar42 = 0;
              }
              ppVar34->score = iVar60;
              ppVar34->end_query = iVar42;
              ppVar34->end_ref = iVar31;
              ((ppVar34->field_4).stats)->matches = iVar29;
              ((ppVar34->field_4).stats)->similar = iVar46;
              ((ppVar34->field_4).stats)->length = iVar47;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar34;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32(vHp, vE);
            vH = _mm_max_epi32(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32 (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32 (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32 (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
        matches = (int32_t) _mm_extract_epi32 (vHM, 3);
        similar = (int32_t) _mm_extract_epi32 (vHS, 3);
        length = (int32_t) _mm_extract_epi32 (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}